

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-fight-perm.c
# Opt level: O0

int borg_perma_aux_prot_evil(void)

{
  _Bool _Var1;
  int iVar2;
  int local_1c;
  int local_14;
  int fail_allowed;
  int cost;
  
  local_14 = 5;
  if (borg.temp.prot_from_evil) {
    fail_allowed = 0;
  }
  else {
    if (unique_on_level != 0) {
      local_14 = 10;
    }
    if (borg_fighting_unique != L'\0') {
      local_14 = 0xf;
    }
    _Var1 = borg_spell_okay_fail(PROTECTION_FROM_EVIL,local_14);
    if (_Var1) {
      iVar2 = borg_get_spell_power(PROTECTION_FROM_EVIL);
      if (unique_on_level == 0) {
        local_1c = borg.trait[0x1e] / 10;
      }
      else {
        local_1c = borg.trait[0x1e] / 7;
      }
      if (iVar2 < local_1c) {
        if ((borg_simulate & 1U) == 0) {
          _Var1 = borg_spell_fail(PROTECTION_FROM_EVIL,local_14);
          if (_Var1) {
            borg.no_rest_prep = (short)borg.trait[0x23] * 1000;
            fail_allowed = 3;
          }
          else {
            fail_allowed = 0;
          }
        }
        else {
          fail_allowed = 3;
        }
      }
      else {
        fail_allowed = 0;
      }
    }
    else {
      fail_allowed = 0;
    }
  }
  return fail_allowed;
}

Assistant:

static int borg_perma_aux_prot_evil(void)
{
    int cost         = 0;
    int fail_allowed = 5;

    /* if already protected */
    if (borg.temp.prot_from_evil)
        return 0;

    /* increase the threshold */
    if (unique_on_level)
        fail_allowed = 10;
    if (borg_fighting_unique)
        fail_allowed = 15;

    if (!borg_spell_okay_fail(PROTECTION_FROM_EVIL, fail_allowed))
        return 0;

    /* Obtain the cost of the spell */
    cost = borg_get_spell_power(PROTECTION_FROM_EVIL);

    /* If its cheap, go ahead */
    if (cost >= ((unique_on_level) ? borg.trait[BI_CURSP] / 7
                                   : borg.trait[BI_CURSP] / 10))
        return 0;

    /* Simulation */
    if (borg_simulate)
        return 3;

    /* do it! */
    if (borg_spell_fail(PROTECTION_FROM_EVIL, fail_allowed)) {
        /* No resting to recoup mana */
        borg.no_rest_prep = borg.trait[BI_CLEVEL] * 1000;

        /* Value */
        return 3;
    }

    /* default to can't do it. */
    return 0;
}